

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O3

void __thiscall fc_layer_t::fix_weights(fc_layer_t *this)

{
  float fVar1;
  pointer pgVar2;
  undefined1 auVar3 [16];
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  int _x;
  int _y;
  int iVar8;
  
  iVar8 = (this->super_layer_t).out.size.x;
  if (0 < iVar8) {
    iVar4 = (this->super_layer_t).in.size.x;
    lVar7 = 0;
    do {
      pgVar2 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        iVar8 = (this->super_layer_t).in.size.y;
        _x = 0;
        do {
          if (0 < iVar8) {
            iVar4 = (this->super_layer_t).in.size.z;
            _y = 0;
            do {
              if (0 < iVar4) {
                iVar8 = 0;
                do {
                  pfVar5 = tensor_t<float>::get
                                     (&this->weights,
                                      ((this->super_layer_t).in.size.y * iVar8 + _y) *
                                      (this->super_layer_t).in.size.x + _x,(int)lVar7,0);
                  fVar1 = *pfVar5;
                  pfVar6 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,iVar8);
                  auVar3 = vfmadd213ss_fma(ZEXT416((uint)pgVar2[lVar7].oldgrad),
                                           SUB6416(ZEXT464(0x3f19999a),0),
                                           ZEXT416((uint)pgVar2[lVar7].grad));
                  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(*pfVar6 * -0.01 * auVar3._0_4_)),
                                           SUB6416(ZEXT464(0x3f7fff58),0),ZEXT416((uint)fVar1));
                  *pfVar5 = auVar3._0_4_;
                  iVar8 = iVar8 + 1;
                  iVar4 = (this->super_layer_t).in.size.z;
                } while (iVar8 < iVar4);
                iVar8 = (this->super_layer_t).in.size.y;
              }
              _y = _y + 1;
            } while (_y < iVar8);
            iVar4 = (this->super_layer_t).in.size.x;
          }
          _x = _x + 1;
        } while (_x < iVar4);
        iVar8 = (this->super_layer_t).out.size.x;
      }
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)pgVar2[lVar7].oldgrad),SUB6416(ZEXT464(0x3f19999a),0),
                               ZEXT416((uint)pgVar2[lVar7].grad));
      pgVar2[lVar7].oldgrad = auVar3._0_4_;
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar8);
  }
  return;
}

Assistant:

void fix_weights() {
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            float &w = weights(m, n, 0);
            w = update_weight(w, grad, in(i, j, z));
          }

      update_gradient(grad);
    }
  }